

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

FILE * cmsys::SystemTools::Fopen(string *file,char *mode)

{
  char *__filename;
  FILE *pFVar1;
  char *mode_local;
  string *file_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,mode);
  return (FILE *)pFVar1;
}

Assistant:

FILE* SystemTools::Fopen(const std::string& file, const char* mode)
{
#ifdef _WIN32
  // Remove any 'e', which is supported on UNIX, but not Windows.
  std::wstring trimmedMode = Encoding::ToWide(mode);
  trimmedMode.erase(std::remove(trimmedMode.begin(), trimmedMode.end(), L'e'),
                    trimmedMode.end());
  return _wfopen(Encoding::ToWindowsExtendedPath(file).c_str(),
                 trimmedMode.c_str());
#else
  return fopen(file.c_str(), mode);
#endif
}